

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBar::clear(ToolBar *this)

{
  qsizetype qVar1;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  QList<QAction_*> actions;
  ToolBar *this_local;
  
  actions.d.size = (qsizetype)this;
  QWidget::actions();
  local_2c = 0;
  while( true ) {
    qVar1 = QList<QAction_*>::size((QList<QAction_*> *)local_28);
    if (qVar1 <= local_2c) break;
    QList<QAction_*>::at((QList<QAction_*> *)local_28,(long)local_2c);
    QWidget::removeAction((QAction *)this);
    local_2c = local_2c + 1;
  }
  QList<QAction_*>::~QList((QList<QAction_*> *)local_28);
  return;
}

Assistant:

void
ToolBar::clear()
{
	QList< QAction* > actions = this->actions();

	for( int i = 0; i < actions.size(); ++i )
		removeAction( actions.at( i ) );
}